

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O1

gs_val_t *
golf_script_eval_fn(gs_val_t *__return_storage_ptr__,golf_script_t *script,char *name,gs_val_t *args
                   ,int num_args)

{
  vec_gs_env_t *data;
  int *length;
  gs_env_t **ppgVar1;
  map_base_t *m;
  undefined8 uVar2;
  int iVar3;
  map_base_t *m_00;
  map_node_t **ppmVar4;
  undefined8 *puVar5;
  map_node_t *pmVar6;
  char *pcVar7;
  ulong uVar8;
  long lVar9;
  bool bVar10;
  
  m_00 = (map_base_t *)golf_alloc_tracked(0x38,"script/eval");
  m_00->buckets = (map_node_t **)0x0;
  m_00->nbuckets = 0;
  m_00->nnodes = 0;
  m_00[1].buckets = (map_node_t **)0x0;
  m_00[1].nbuckets = 0;
  m_00[1].nnodes = 0;
  m_00[2].buckets = (map_node_t **)0x0;
  m_00[2].nbuckets = 0;
  m_00[2].nnodes = 0;
  m_00[3].buckets = (map_node_t **)"script/eval";
  data = &(script->eval).env;
  length = &(script->eval).env.length;
  pmVar6 = (map_node_t *)0x8;
  iVar3 = vec_expand_((char **)data,length,&(script->eval).env.capacity,8,
                      (script->eval).env.alloc_category);
  if (iVar3 == 0) {
    ppgVar1 = data->data;
    pmVar6 = (map_node_t *)(long)*length;
    *length = *length + 1;
    ppgVar1[(long)pmVar6] = (gs_env_t *)m_00;
  }
  uVar8 = (ulong)(uint)*length;
  do {
    if ((int)uVar8 < 1) {
      bVar10 = false;
      goto LAB_001399a6;
    }
    m = (map_base_t *)data->data[uVar8 - 1];
    uVar8 = uVar8 - 1;
    ppmVar4 = (map_node_t **)map_get_(m,name);
    m[1].buckets = ppmVar4;
  } while (ppmVar4 == (map_node_t **)0x0);
  pmVar6 = ppmVar4[1];
  bVar10 = *(int *)ppmVar4 == 8;
LAB_001399a6:
  if (bVar10) {
    if (*(int *)&pmVar6[1].next == num_args) {
      if (0 < num_args) {
        lVar9 = 0x10;
        uVar8 = 0;
        do {
          if (*(int *)(*(long *)(pmVar6 + 2) + uVar8 * 4) != *(int *)((long)args + lVar9 + -0x10)) {
            gs_val_error(__return_storage_ptr__,"Invalid arg type");
            iVar3 = 2;
            goto LAB_00139a79;
          }
          puVar5 = (undefined8 *)((long)&args->type + lVar9);
          pcVar7 = *(char **)((long)pmVar6[2].value + lVar9);
          uVar2 = *puVar5;
          m_00[2].nbuckets = (int)uVar2;
          m_00[2].nnodes = (int)((ulong)uVar2 >> 0x20);
          uVar2 = puVar5[-2];
          ppmVar4 = (map_node_t **)puVar5[-1];
          m_00[1].nbuckets = (int)uVar2;
          m_00[1].nnodes = (int)((ulong)uVar2 >> 0x20);
          m_00[2].buckets = ppmVar4;
          map_set_(m_00,pcVar7,&m_00[1].nbuckets,0x18,(char *)m_00[3].buckets);
          uVar8 = uVar8 + 1;
          lVar9 = lVar9 + 0x18;
        } while ((uint)num_args != uVar8);
      }
      iVar3 = 3;
LAB_00139a79:
      if (iVar3 != 2) {
        if (iVar3 != 3) {
          return __return_storage_ptr__;
        }
        gs_eval_stmt(__return_storage_ptr__,&script->eval,(gs_stmt_t *)pmVar6[2].next);
      }
      goto LAB_00139ab5;
    }
    pcVar7 = "Invalid number of args";
  }
  else {
    pcVar7 = "Could not find function";
  }
  gs_val_error(__return_storage_ptr__,pcVar7);
LAB_00139ab5:
  *length = *length + -1;
  map_deinit_(m_00);
  golf_free_tracked(m_00);
  return __return_storage_ptr__;
}

Assistant:

gs_val_t golf_script_eval_fn(golf_script_t *script, const char *name, gs_val_t *args, int num_args) {
    gs_val_t val;
    gs_env_t *env = golf_alloc_tracked(sizeof(gs_env_t), "script/eval");
    map_init(&env->val_map, "script/eval");
    vec_push(&script->eval.env, env);

    gs_val_t fn_val;
    if (!golf_script_get_val(script, name, &fn_val) || fn_val.type != GS_VAL_FN) {
        val = gs_val_error("Could not find function");
        goto cleanup;
    }

    gs_stmt_t *fn_stmt = (gs_stmt_t*) fn_val.fn_stmt;
    if (num_args != fn_stmt->fn_decl.num_args) {
        val = gs_val_error("Invalid number of args");
        goto cleanup;
    }

    for (int i = 0; i < num_args; i++) {
        const char *symbol = fn_stmt->fn_decl.arg_symbols[i].symbol;
        gs_val_type type = fn_stmt->fn_decl.arg_types[i];
        if (type != args[i].type) {
            val = gs_val_error("Invalid arg type");
            goto cleanup;
        }
        map_set(&env->val_map, symbol, args[i]);
    }

    val = gs_eval_stmt(&script->eval, fn_stmt->fn_decl.body);

cleanup:
    (void)vec_pop(&script->eval.env);
    map_deinit(&env->val_map);
    golf_free(env);
    return val;
}